

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version.cpp
# Opt level: O1

ostream * setup::operator<<(ostream *os,version *version)

{
  ostream *poVar1;
  char local_1b [3];
  
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)os);
  local_1b[0] = '.';
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_1b,1);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  local_1b[1] = 0x2e;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_1b + 1,1);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  if ((char)version->value != '\0') {
    local_1b[2] = 0x2e;
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>(os,local_1b + 2,1);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  }
  if (((version->variant)._flags.super__Base_bitset<1UL>._M_w & 2) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(os," (unicode)",10);
  }
  if (((version->variant)._flags.super__Base_bitset<1UL>._M_w & 1) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(os," (",2);
    poVar1 = (ostream *)
             std::ostream::operator<<
                       (os,(uint)(((version->variant)._flags.super__Base_bitset<1UL>._M_w & 1) == 0)
                           * 0x10 + 0x10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"-bit)",5);
  }
  if (((version->variant)._flags.super__Base_bitset<1UL>._M_w & 4) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(os," (isx)",6);
  }
  return os;
}

Assistant:

std::ostream & operator<<(std::ostream & os, const version & version) {
	
	os << version.a() << '.' << version.b() << '.' << version.c();
	if(version.d()) {
		os << '.' << version.d();
	}
	
	if(version.is_unicode()) {
		os << " (unicode)";
	}
	
	if(version.bits() != 32) {
		os << " (" << int(version.bits()) << "-bit)";
	}
	
	if(version.is_isx()) {
		os << " (isx)";
	}
	
	return os;
}